

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_read_header_procedure
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  uint uVar1;
  opj_ppx *poVar2;
  OPJ_BOOL OVar3;
  OPJ_SIZE_T OVar4;
  OPJ_OFF_T OVar5;
  opj_dec_memory_marker_handler *poVar6;
  OPJ_BYTE *pOVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  uint uVar12;
  OPJ_UINT32 OVar13;
  size_t size;
  OPJ_BYTE *pOVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  bool bVar19;
  int local_60;
  OPJ_UINT32 l_N_ppm;
  OPJ_UINT32 l_current_marker;
  OPJ_UINT32 l_marker_size;
  ulong local_50;
  opj_codestream_index_t *local_48;
  ulong local_40;
  opj_codestream_index_t *local_38;
  
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1c0f,
                  "OPJ_BOOL opj_j2k_read_header_procedure(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1c10,
                  "OPJ_BOOL opj_j2k_read_header_procedure(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1c11,
                  "OPJ_BOOL opj_j2k_read_header_procedure(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  (p_j2k->m_specific_param).m_decoder.m_state = 1;
  OVar4 = opj_stream_read_data(p_stream,(OPJ_BYTE *)&l_current_marker,2,p_manager);
  if ((OVar4 == 2) &&
     (opj_read_bytes_LE((OPJ_BYTE *)&l_current_marker,&l_N_ppm,2), l_N_ppm == 0xff4f)) {
    (p_j2k->m_specific_param).m_decoder.m_state = 2;
    OVar5 = opj_stream_tell(p_stream);
    p_j2k->cstr_index->main_head_start = OVar5 + -2;
    opj_event_msg(p_manager,4,"Start to read j2k main header (%d).\n");
    OVar3 = opj_j2k_add_mhmarker(p_j2k->cstr_index,0xff4f,p_j2k->cstr_index->main_head_start,2);
    if (OVar3 != 0) {
      OVar4 = opj_stream_read_data
                        (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,p_manager);
      if (OVar4 != 2) {
LAB_0010fa4b:
        pcVar11 = "Stream too short\n";
        goto LAB_0010fa32;
      }
      iVar17 = 1;
      opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&l_current_marker,2);
      local_60 = 0;
      local_50 = local_50 & 0xffffffff00000000;
      local_40 = local_40 & 0xffffffff00000000;
      while (l_current_marker != 0xff90) {
        if (l_current_marker < 0xff00) {
          opj_event_msg(p_manager,1,"A marker ID was expected (0xff--) instead of %.8x\n");
          return 0;
        }
        poVar6 = opj_j2k_get_marker_handler(l_current_marker);
        OVar13 = poVar6->id;
        if (OVar13 == 0) {
          opj_event_msg(p_manager,2,"Unknown marker\n");
          local_48 = (opj_codestream_index_t *)CONCAT44(local_48._4_4_,2);
          while( true ) {
            do {
              OVar4 = opj_stream_read_data
                                (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,
                                 p_manager);
              if (OVar4 != 2) {
                pcVar11 = "Stream too short\n";
                goto LAB_0010fa5b;
              }
              opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&l_N_ppm,2);
            } while (l_N_ppm < 0xff00);
            poVar6 = opj_j2k_get_marker_handler(l_N_ppm);
            if (((p_j2k->m_specific_param).m_decoder.m_state & poVar6->states) == 0) {
              pcVar11 = "Marker is not compliant with its position\n";
              goto LAB_0010fa5b;
            }
            if (poVar6->id != 0) break;
            local_48 = (opj_codestream_index_t *)CONCAT44(local_48._4_4_,(OPJ_UINT32)local_48 + 2);
          }
          if (poVar6->id == 0xff90) {
            l_current_marker = 0xff90;
            break;
          }
          local_38 = p_j2k->cstr_index;
          OVar5 = opj_stream_tell(p_stream);
          OVar3 = opj_j2k_add_mhmarker
                            (local_38,0,(ulong)((int)OVar5 - (OPJ_UINT32)local_48),
                             (OPJ_UINT32)local_48);
          if (OVar3 == 0) {
            pcVar11 = "Not enough memory to add mh marker\n";
LAB_0010fa5b:
            opj_event_msg(p_manager,1,pcVar11);
            pcVar11 = "Unknow marker have been detected and generated error.\n";
            goto LAB_0010fa32;
          }
          l_current_marker = poVar6->id;
          if (l_current_marker == 0xff90) break;
          poVar6 = opj_j2k_get_marker_handler(l_current_marker);
          OVar13 = poVar6->id;
        }
        if (OVar13 == 0xff51) {
          local_60 = iVar17;
        }
        iVar10 = (int)local_50;
        if (OVar13 == 0xff52) {
          iVar10 = iVar17;
        }
        iVar9 = (int)local_40;
        if (OVar13 == 0xff5c) {
          iVar9 = iVar17;
        }
        if (((p_j2k->m_specific_param).m_decoder.m_state & poVar6->states) == 0) {
          pcVar11 = "Marker is not compliant with its position\n";
          goto LAB_0010fa32;
        }
        local_50 = CONCAT44(local_50._4_4_,iVar10);
        local_40 = CONCAT44(local_40._4_4_,iVar9);
        OVar4 = opj_stream_read_data
                          (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,p_manager);
        if (OVar4 != 2) goto LAB_0010fa4b;
        opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&l_marker_size,2);
        l_marker_size = l_marker_size - 2;
        pOVar7 = (p_j2k->m_specific_param).m_decoder.m_header_data;
        if ((p_j2k->m_specific_param).m_decoder.m_header_data_size < l_marker_size) {
          pOVar7 = (OPJ_BYTE *)opj_realloc(pOVar7,(ulong)l_marker_size);
          if (pOVar7 == (OPJ_BYTE *)0x0) {
            opj_free((p_j2k->m_specific_param).m_decoder.m_header_data);
            (p_j2k->m_specific_param).m_decoder.m_header_data = (OPJ_BYTE *)0x0;
            (p_j2k->m_specific_param).m_decoder.m_header_data_size = 0;
            pcVar11 = "Not enough memory to read header\n";
            goto LAB_0010fa32;
          }
          (p_j2k->m_specific_param).m_decoder.m_header_data = pOVar7;
          (p_j2k->m_specific_param).m_decoder.m_header_data_size = l_marker_size;
        }
        OVar4 = opj_stream_read_data(p_stream,pOVar7,(ulong)l_marker_size,p_manager);
        if (OVar4 != l_marker_size) goto LAB_0010fa4b;
        OVar3 = (*poVar6->handler)(p_j2k,(p_j2k->m_specific_param).m_decoder.m_header_data,
                                   l_marker_size,p_manager);
        if (OVar3 == 0) {
          pcVar11 = "Marker handler function failed to read the marker segment\n";
          goto LAB_0010fa32;
        }
        local_48 = p_j2k->cstr_index;
        OVar13 = poVar6->id;
        OVar5 = opj_stream_tell(p_stream);
        OVar3 = opj_j2k_add_mhmarker
                          (local_48,OVar13,(ulong)(((int)OVar5 - l_marker_size) - 4),
                           l_marker_size + 4);
        if (OVar3 == 0) {
          pcVar11 = "Not enough memory to add mh marker\n";
          goto LAB_0010fa32;
        }
        OVar4 = opj_stream_read_data
                          (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,p_manager);
        if (OVar4 != 2) goto LAB_0010fa4b;
        opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&l_current_marker,2);
      }
      if (local_60 == 0) {
        pcVar11 = "required SIZ marker not found in main header\n";
        goto LAB_0010fa32;
      }
      if ((int)local_50 == 0) {
        pcVar11 = "required COD marker not found in main header\n";
        goto LAB_0010fa32;
      }
      if ((int)local_40 == 0) {
        pcVar11 = "required QCD marker not found in main header\n";
        goto LAB_0010fa32;
      }
      if ((p_j2k->m_cp).ppm_buffer != (OPJ_BYTE *)0x0) {
        __assert_fail("p_cp->ppm_buffer == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                      ,0xe44,"OPJ_BOOL opj_j2k_merge_ppm(opj_cp_t *, opj_event_mgr_t *)");
      }
      if (((p_j2k->m_cp).field_0x90 & 1) == 0) {
LAB_0010faf4:
        opj_event_msg(p_manager,4,"Main header has been correctly decoded.\n");
        OVar5 = opj_stream_tell(p_stream);
        p_j2k->cstr_index->main_head_end = (ulong)((int)OVar5 - 2);
        (p_j2k->m_specific_param).m_decoder.m_state = 8;
        return 1;
      }
      size = 0;
      uVar16 = 0;
      for (uVar8 = 0; uVar8 < (p_j2k->m_cp).ppm_markers_count; uVar8 = uVar8 + 1) {
        poVar2 = (p_j2k->m_cp).ppm_markers;
        pOVar7 = poVar2[uVar8].m_data;
        uVar12 = uVar16;
        if (pOVar7 != (OPJ_BYTE *)0x0) {
          uVar1 = poVar2[uVar8].m_data_size;
          uVar12 = uVar16 - uVar1;
          if (uVar16 < uVar1) {
            uVar12 = 0;
          }
          uVar15 = uVar1 - uVar16;
          local_50 = uVar8;
          if (uVar16 <= uVar1 && uVar15 != 0) {
            pOVar7 = pOVar7 + uVar16;
            do {
              if (uVar15 < 4) goto LAB_0010fd5e;
              opj_read_bytes_LE(pOVar7,&l_N_ppm,4);
              uVar16 = uVar15 - 4;
              size = (size_t)((int)size + l_N_ppm);
              bVar19 = l_N_ppm <= uVar16;
              uVar15 = uVar16 - l_N_ppm;
              if (!bVar19) {
                uVar12 = l_N_ppm - uVar16;
              }
              uVar8 = (ulong)l_N_ppm;
              if (!bVar19) {
                uVar8 = 0;
              }
              pOVar7 = pOVar7 + uVar8 + 4;
              uVar8 = local_50;
            } while (bVar19 && uVar15 != 0);
          }
        }
        uVar16 = uVar12;
      }
      if (uVar16 == 0) {
        pOVar7 = (OPJ_BYTE *)opj_malloc(size);
        (p_j2k->m_cp).ppm_buffer = pOVar7;
        if (pOVar7 != (OPJ_BYTE *)0x0) {
          (p_j2k->m_cp).ppm_len = (OPJ_UINT32)size;
          uVar18 = 0;
          OVar13 = 0;
          for (uVar8 = 0; iVar17 = (int)uVar18, uVar8 < (p_j2k->m_cp).ppm_markers_count;
              uVar8 = uVar8 + 1) {
            poVar2 = (p_j2k->m_cp).ppm_markers;
            pOVar7 = poVar2[uVar8].m_data;
            if (pOVar7 != (OPJ_BYTE *)0x0) {
              uVar16 = poVar2[uVar8].m_data_size;
              pOVar14 = (p_j2k->m_cp).ppm_buffer + uVar18;
              local_50 = uVar8;
              local_40 = uVar8 * 0x10;
              if (OVar13 < uVar16) {
                local_48 = (opj_codestream_index_t *)(ulong)OVar13;
                memcpy(pOVar14,pOVar7,(size_t)local_48);
                uVar18 = (ulong)(iVar17 + OVar13);
                uVar16 = uVar16 - OVar13;
                if (uVar16 != 0) {
                  pOVar7 = pOVar7 + (long)local_48;
                  do {
                    iVar17 = (int)uVar18;
                    if (uVar16 < 4) goto LAB_0010fd5e;
                    opj_read_bytes_LE(pOVar7,&l_N_ppm,4);
                    pOVar7 = pOVar7 + 4;
                    uVar16 = uVar16 - 4;
                    pOVar14 = (p_j2k->m_cp).ppm_buffer + uVar18;
                    if (uVar16 < l_N_ppm) {
                      memcpy(pOVar14,pOVar7,(ulong)uVar16);
                      OVar13 = l_N_ppm;
                      goto LAB_0010fd11;
                    }
                    memcpy(pOVar14,pOVar7,(ulong)l_N_ppm);
                    pOVar7 = pOVar7 + l_N_ppm;
                    uVar18 = (ulong)(iVar17 + l_N_ppm);
                    uVar16 = uVar16 - l_N_ppm;
                  } while (uVar16 != 0);
                }
                OVar13 = 0;
              }
              else {
                memcpy(pOVar14,pOVar7,(ulong)uVar16);
LAB_0010fd11:
                OVar13 = OVar13 - uVar16;
                uVar18 = (ulong)(iVar17 + uVar16);
              }
              uVar8 = local_40;
              opj_free(*(void **)((long)&((p_j2k->m_cp).ppm_markers)->m_data + local_40));
              poVar2 = (p_j2k->m_cp).ppm_markers;
              *(undefined8 *)((long)&poVar2->m_data + uVar8) = 0;
              *(undefined4 *)((long)&poVar2->m_data_size + uVar8) = 0;
              uVar8 = local_50;
            }
          }
          (p_j2k->m_cp).ppm_data = (p_j2k->m_cp).ppm_buffer;
          (p_j2k->m_cp).ppm_data_size = (p_j2k->m_cp).ppm_len;
          (p_j2k->m_cp).ppm_markers_count = 0;
          opj_free((p_j2k->m_cp).ppm_markers);
          (p_j2k->m_cp).ppm_markers = (opj_ppx *)0x0;
          goto LAB_0010faf4;
        }
        pcVar11 = "Not enough memory to read PPM marker\n";
      }
      else {
        pcVar11 = "Corrupted PPM markers\n";
      }
      goto LAB_0010fd65;
    }
    opj_event_msg(p_manager,1,"Not enough memory to add mh marker\n");
  }
  pcVar11 = "Expected a SOC marker \n";
LAB_0010fa32:
  opj_event_msg(p_manager,1,pcVar11);
  return 0;
LAB_0010fd5e:
  pcVar11 = "Not enough bytes to read Nppm\n";
LAB_0010fd65:
  opj_event_msg(p_manager,1,pcVar11);
  pcVar11 = "Failed to merge PPM data\n";
  goto LAB_0010fa32;
}

Assistant:

static OPJ_BOOL opj_j2k_read_header_procedure( opj_j2k_t *p_j2k,
                                                                            opj_stream_private_t *p_stream,
                                                                            opj_event_mgr_t * p_manager)
{
        OPJ_UINT32 l_current_marker;
        OPJ_UINT32 l_marker_size;
        const opj_dec_memory_marker_handler_t * l_marker_handler = 00;
        OPJ_BOOL l_has_siz = 0;
        OPJ_BOOL l_has_cod = 0;
        OPJ_BOOL l_has_qcd = 0;

        /* preconditions */
        assert(p_stream != 00);
        assert(p_j2k != 00);
        assert(p_manager != 00);

        /*  We enter in the main header */
        p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_MHSOC;

        /* Try to read the SOC marker, the codestream must begin with SOC marker */
        if (! opj_j2k_read_soc(p_j2k,p_stream,p_manager)) {
                opj_event_msg(p_manager, EVT_ERROR, "Expected a SOC marker \n");
                return OPJ_FALSE;
        }

        /* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer */
        if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
                opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                return OPJ_FALSE;
        }

        /* Read 2 bytes as the new marker ID */
        opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);

        /* Try to read until the SOT is detected */
        while (l_current_marker != J2K_MS_SOT) {

                /* Check if the current marker ID is valid */
                if (l_current_marker < 0xff00) {
                        opj_event_msg(p_manager, EVT_ERROR, "A marker ID was expected (0xff--) instead of %.8x\n", l_current_marker);
                        return OPJ_FALSE;
                }

                /* Get the marker handler from the marker ID */
                l_marker_handler = opj_j2k_get_marker_handler(l_current_marker);

                /* Manage case where marker is unknown */
                if (l_marker_handler->id == J2K_MS_UNK) {
                        if (! opj_j2k_read_unk(p_j2k, p_stream, &l_current_marker, p_manager)){
                                opj_event_msg(p_manager, EVT_ERROR, "Unknow marker have been detected and generated error.\n");
                                return OPJ_FALSE;
                        }

                        if (l_current_marker == J2K_MS_SOT)
                                break; /* SOT marker is detected main header is completely read */
                        else    /* Get the marker handler from the marker ID */
                                l_marker_handler = opj_j2k_get_marker_handler(l_current_marker);
                }

                if (l_marker_handler->id == J2K_MS_SIZ) {
                    /* Mark required SIZ marker as found */
                    l_has_siz = 1;
                }
                if (l_marker_handler->id == J2K_MS_COD) {
                    /* Mark required COD marker as found */
                    l_has_cod = 1;
                }
                if (l_marker_handler->id == J2K_MS_QCD) {
                    /* Mark required QCD marker as found */
                    l_has_qcd = 1;
                }

                /* Check if the marker is known and if it is the right place to find it */
                if (! (p_j2k->m_specific_param.m_decoder.m_state & l_marker_handler->states) ) {
                        opj_event_msg(p_manager, EVT_ERROR, "Marker is not compliant with its position\n");
                        return OPJ_FALSE;
                }

                /* Try to read 2 bytes (the marker size) from stream and copy them into the buffer */
                if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
                        opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                        return OPJ_FALSE;
                }

                /* read 2 bytes as the marker size */
                opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_marker_size,2);
                l_marker_size -= 2; /* Subtract the size of the marker ID already read */

                /* Check if the marker size is compatible with the header data size */
                if (l_marker_size > p_j2k->m_specific_param.m_decoder.m_header_data_size) {
                        OPJ_BYTE *new_header_data = (OPJ_BYTE *) opj_realloc(p_j2k->m_specific_param.m_decoder.m_header_data, l_marker_size);
                        if (! new_header_data) {
                                opj_free(p_j2k->m_specific_param.m_decoder.m_header_data);
                                p_j2k->m_specific_param.m_decoder.m_header_data = NULL;
                                p_j2k->m_specific_param.m_decoder.m_header_data_size = 0;
                                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read header\n");
                                return OPJ_FALSE;
                        }
                        p_j2k->m_specific_param.m_decoder.m_header_data = new_header_data;
                        p_j2k->m_specific_param.m_decoder.m_header_data_size = l_marker_size;
                }

                /* Try to read the rest of the marker segment from stream and copy them into the buffer */
                if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size,p_manager) != l_marker_size) {
                        opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                        return OPJ_FALSE;
                }

                /* Read the marker segment with the correct marker handler */
                if (! (*(l_marker_handler->handler))(p_j2k,p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size,p_manager)) {
                        opj_event_msg(p_manager, EVT_ERROR, "Marker handler function failed to read the marker segment\n");
                        return OPJ_FALSE;
                }

                /* Add the marker to the codestream index*/
                if (OPJ_FALSE == opj_j2k_add_mhmarker(
                                        p_j2k->cstr_index,
                                        l_marker_handler->id,
                                        (OPJ_UINT32) opj_stream_tell(p_stream) - l_marker_size - 4,
                                        l_marker_size + 4 )) {
                        opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to add mh marker\n");
                        return OPJ_FALSE;
                }

                /* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer */
                if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
                        opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                        return OPJ_FALSE;
                }

                /* read 2 bytes as the new marker ID */
                opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);
        }

        if (l_has_siz == 0) {
            opj_event_msg(p_manager, EVT_ERROR, "required SIZ marker not found in main header\n");
            return OPJ_FALSE;
        }
        if (l_has_cod == 0) {
            opj_event_msg(p_manager, EVT_ERROR, "required COD marker not found in main header\n");
            return OPJ_FALSE;
        }
        if (l_has_qcd == 0) {
            opj_event_msg(p_manager, EVT_ERROR, "required QCD marker not found in main header\n");
            return OPJ_FALSE;
        }
	
        if (! opj_j2k_merge_ppm(&(p_j2k->m_cp), p_manager)) {
            opj_event_msg(p_manager, EVT_ERROR, "Failed to merge PPM data\n");
            return OPJ_FALSE;
        }

        opj_event_msg(p_manager, EVT_INFO, "Main header has been correctly decoded.\n");

        /* Position of the last element if the main header */
        p_j2k->cstr_index->main_head_end = (OPJ_UINT32) opj_stream_tell(p_stream) - 2;

        /* Next step: read a tile-part header */
        p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_TPHSOT;

        return OPJ_TRUE;
}